

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_char16_t_ptr_uint *string_function)

{
  SizeT SVar1;
  uint size;
  uint uVar2;
  char16_t *to;
  Value<char16_t> *pVVar3;
  StringStream<char16_t> SVar4;
  Char_T storage [20];
  Value<char16_t> VStack_68;
  char16_t local_40 [4];
  StringStream<char16_t> local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  uVar2 = 0x139150;
  switch(this->type_) {
  case String:
    if (string_function != (_func_void_StringStream<char16_t>_char16_t_ptr_uint *)0x0) {
      StringStream<char16_t>::StringStream(&local_38,stream);
      SVar4._8_8_ = (this->field_0).array_.storage_;
      SVar4.storage_ = (char16_t *)&local_38;
      (*string_function)(SVar4,(char16_t *)(ulong)(this->field_0).array_.index_,uVar2);
      if (local_38.storage_ != (char16_t *)0x0) {
        MemoryRecord::RemoveAllocation(local_38.storage_);
      }
      operator_delete(local_38.storage_);
      return true;
    }
    pVVar3 = (this->field_0).array_.storage_;
    SVar1 = (this->field_0).array_.index_;
    uVar2 = stream->length_ + SVar1;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    size = SVar1 * 2;
    goto LAB_0012c5b1;
  case UIntLong:
    pVVar3 = (this->field_0).array_.storage_;
    break;
  case IntLong:
    pVVar3 = (this->field_0).array_.storage_;
    if ((long)pVVar3 < 0) {
      SVar1 = stream->length_ + 1;
      if (stream->capacity_ == stream->length_) {
        StringStream<char16_t>::expand(stream,SVar1);
      }
      pVVar3 = (Value<char16_t> *)-(long)pVVar3;
      stream->storage_[stream->length_] = L'-';
      stream->length_ = SVar1;
    }
    break;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,format);
    return true;
  case True:
    uVar2 = stream->length_ + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pVVar3 = (Value<char16_t> *)0x13dc16;
    goto LAB_0012c5ac;
  case False:
    uVar2 = stream->length_ + 5;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pVVar3 = (Value<char16_t> *)0x13fae4;
    size = 10;
    goto LAB_0012c5b1;
  case Null:
    uVar2 = stream->length_ + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pVVar3 = (Value<char16_t> *)0x1399dc;
LAB_0012c5ac:
    size = 8;
    goto LAB_0012c5b1;
  default:
    return false;
  }
  SVar1 = Digit::IntToString<false,char16_t,unsigned_long_long>(local_40,(unsigned_long_long)pVVar3)
  ;
  uVar2 = stream->length_ + SVar1;
  if (stream->capacity_ < uVar2) {
    StringStream<char16_t>::expand(stream,uVar2);
  }
  pVVar3 = (Value<char16_t> *)((long)&VStack_68.field_0 + (ulong)(0x14 - SVar1) * 2);
  to = stream->storage_ + stream->length_;
  size = SVar1 * 2;
LAB_0012c5b1:
  Memory::Copy<unsigned_int>(to,pVVar3,size);
  stream->length_ = uVar2;
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }